

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall front::irGenerator::irGenerator::irGenerator(irGenerator *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  string *local_48;
  string *local_40;
  string *local_38;
  
  mir::inst::MirPackage::MirPackage(&this->_package);
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_funcNameToInstructions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_InitStringId = 0;
  this->_InitLabelId = 0;
  this->_InitLocalVarId = 1;
  this->_InitTmpVarId = 0x8000;
  this->_VoidVarId = 0x100000;
  this->_ReturnBlockLabelId = 0x100000;
  this->_ReturnVarId = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_GlobalInitFuncName,"main",&local_49);
  local_38 = &this->_GlobalInitFuncName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_VoidVarName,"v_Compiler_Void_Var_Name_$$",&local_4a);
  local_40 = &this->_VoidVarName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_ReturnVarName,"r__Compiler_Retuen_Var_Name__$$",&local_4b);
  local_48 = &this->_ReturnVarName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_StringNamePrefix,"s_",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_TmpNamePrefix,"t_",&local_4d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_ConstNamePrefix,"c_",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_VarNamePrefix,"v_",&local_4f)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_GenSaveParamVarNamePrefix,"sp_",&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_FunctionNamePrefix,"f_",&local_51);
  p_Var1 = &(this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_whileStack).
  super__Vector_base<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_funcNameToFuncData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_stringToName)._M_t._M_impl.super__Rb_tree_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_stringToName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

irGenerator::irGenerator() {}